

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int __thiscall
despot::Parser::ComputeNumOfEntries
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *instance,vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents,
          NamedVar *child)

{
  int iVar1;
  NamedVar *pNVar2;
  ulong uVar3;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  ulong uVar7;
  
  pbVar5 = (instance->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((instance->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar5) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6));
      pbVar5 = (instance->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(instance->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5;
      if (iVar1 == 0) {
        pNVar2 = child;
        if (uVar7 < uVar3 - 1) {
          pNVar2 = (parents->
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar7];
        }
        iVar4 = iVar4 * (int)((ulong)((long)(pNVar2->super_Variable).values_.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pNVar2->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < uVar3);
  }
  return iVar4;
}

Assistant:

int Parser::ComputeNumOfEntries(const vector<string>& instance,
	const vector<NamedVar*>& parents, const NamedVar* child) const {
	int num_entries = 1;
	for (int i = 0; i < instance.size(); i++) {
		if (instance[i] == "-") {
			if (i < instance.size() - 1)
				num_entries *= parents[i]->Size();
			else
				num_entries *= child->Size();
		}
	}
	return num_entries;
}